

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O3

void __thiscall
helics::apps::WebServer::startServer
          (WebServer *this,json *val,shared_ptr<helics::apps::TypedBrokerServer> *ptr)

{
  byte bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  __time_t _Var4;
  int iVar5;
  json *pjVar6;
  long lVar7;
  int *piVar8;
  invalid_argument *this_00;
  pointer *__ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar9;
  string_view message;
  timespec local_38;
  thread local_28;
  
  message._M_str = "starting broker web server";
  message._M_len = 0x1a;
  TypedBrokerServer::logMessage(message);
  pjVar6 = &::null_abi_cxx11_;
  if (val != (json *)0x0) {
    pjVar6 = val;
  }
  this->config = pjVar6;
  LOCK();
  bVar9 = (this->running)._M_base._M_i == false;
  if (bVar9) {
    (this->running)._M_base._M_i = true;
  }
  UNLOCK();
  if (bVar9) {
    local_38.tv_sec = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::apps::IocWrapper,std::allocator<helics::apps::IocWrapper>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.tv_nsec,
               (IocWrapper **)&local_38,(allocator<helics::apps::IocWrapper> *)&local_28);
    lVar7 = local_38.tv_nsec;
    _Var4 = local_38.tv_sec;
    local_38.tv_sec = 0;
    local_38.tv_nsec = 0;
    p_Var2 = (this->context).
             super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->context).super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)_Var4;
    (this->context).super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)lVar7;
    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.tv_nsec !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.tv_nsec);
    }
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->threadGuard);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    peVar3 = (ptr->super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if ((peVar3 == (element_type *)0x0) ||
       (lVar7 = __dynamic_cast(peVar3,&TypedBrokerServer::typeinfo,&typeinfo,0), lVar7 == 0)) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"pointer to a webserver required for operation");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    p_Var2 = (ptr->super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    local_28._M_id._M_thread = (id)0;
    local_38.tv_sec = (__time_t)operator_new(0x20);
    *(undefined ***)local_38.tv_sec = &PTR___State_impl_0053d6d0;
    *(WebServer **)(local_38.tv_sec + 8) = this;
    *(long *)(local_38.tv_sec + 0x10) = lVar7;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_38.tv_sec + 0x18) = p_Var2;
    std::thread::_M_start_thread(&local_28,&local_38,0);
    if ((long *)local_38.tv_sec != (long *)0x0) {
      (**(code **)(*(long *)local_38.tv_sec + 8))();
    }
    if ((this->mainLoopThread)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->mainLoopThread)._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
    std::thread::detach();
    sched_yield();
    bVar1 = (this->executing)._M_base._M_i;
    while ((bVar1 & 1) == 0) {
      local_38.tv_sec = 0;
      local_38.tv_nsec = 50000000;
      do {
        iVar5 = nanosleep(&local_38,&local_38);
        if (iVar5 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      bVar1 = (this->executing)._M_base._M_i;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
  }
  return;
}

Assistant:

void WebServer::startServer(const nlohmann::json* val,
                            const std::shared_ptr<TypedBrokerServer>& ptr)
{
    logMessage("starting broker web server");
    config = (val != nullptr) ? val : &null;
    bool exp{false};
    if (running.compare_exchange_strong(exp, true)) {
        // The io_context is required for all I/O
        context = std::make_shared<IocWrapper>();

        const std::lock_guard<std::mutex> tlock(threadGuard);

        auto webptr = std::dynamic_pointer_cast<WebServer>(ptr);
        if (!webptr) {
            throw(std::invalid_argument("pointer to a webserver required for operation"));
        }
        mainLoopThread = std::thread([this, webptr = std::move(webptr)]() { mainLoop(webptr); });
        mainLoopThread.detach();
        std::this_thread::yield();
        while (!executing) {
            std::this_thread::sleep_for(std::chrono::milliseconds(50));
        }
    }
}